

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

hmm_context_t * hmm_context_init(int32 n_emit_state,uint8 ***tp,int16 *senscore,uint16 **sseq)

{
  int32 *piVar1;
  hmm_context_t *ctx;
  uint16 **sseq_local;
  int16 *senscore_local;
  uint8 ***tp_local;
  hmm_context_t *phStack_10;
  int32 n_emit_state_local;
  
  if (0 < n_emit_state) {
    if (n_emit_state < 6) {
      phStack_10 = (hmm_context_t *)
                   __ckd_calloc__(1,0x38,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/hmm.c"
                                  ,0x42);
      phStack_10->n_emit_state = n_emit_state;
      phStack_10->tp = tp;
      phStack_10->senscore = senscore;
      phStack_10->sseq = sseq;
      piVar1 = (int32 *)__ckd_calloc__((long)n_emit_state,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/hmm.c"
                                       ,0x47);
      phStack_10->st_sen_scr = piVar1;
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/hmm.c"
              ,0x3e,"Number of emitting states must be <= %d\n",5);
      phStack_10 = (hmm_context_t *)0x0;
    }
    return phStack_10;
  }
  __assert_fail("n_emit_state > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/hmm.c"
                ,0x3c,
                "hmm_context_t *hmm_context_init(int32, uint8 **const *, const int16 *, uint16 *const *)"
               );
}

Assistant:

hmm_context_t *
hmm_context_init(int32 n_emit_state,
		 uint8 ** const *tp,
		 int16 const *senscore,
		 uint16 * const *sseq)
{
    hmm_context_t *ctx;

    assert(n_emit_state > 0);
    if (n_emit_state > HMM_MAX_NSTATE) {
        E_ERROR("Number of emitting states must be <= %d\n", HMM_MAX_NSTATE);
        return NULL;
    }

    ctx = ckd_calloc(1, sizeof(*ctx));
    ctx->n_emit_state = n_emit_state;
    ctx->tp = tp;
    ctx->senscore = senscore;
    ctx->sseq = sseq;
    ctx->st_sen_scr = ckd_calloc(n_emit_state, sizeof(*ctx->st_sen_scr));

    return ctx;
}